

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O2

int duckdb_je_prof_thread_name_set_impl(tsd_t *tsd,char *thread_name)

{
  ushort **ppuVar1;
  uint i;
  uint uVar2;
  ulong uVar3;
  
  ppuVar1 = __ctype_b_loc();
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    uVar2 = uVar2 + 1;
  } while (((*ppuVar1)[thread_name[uVar3]] & 0x8001) != 0);
  return 0x16;
}

Assistant:

int
prof_thread_name_set_impl(tsd_t *tsd, const char *thread_name) {
	assert(tsd_reentrancy_level_get(tsd) == 0);
	assert(thread_name != NULL);

	for (unsigned i = 0; thread_name[i] != '\0'; i++) {
		char c = thread_name[i];
		if (!isgraph(c) && !isblank(c)) {
			return EINVAL;
		}
	}

	prof_tdata_t *tdata = prof_tdata_get(tsd, true);
	if (tdata == NULL) {
		return ENOMEM;
	}

	prof_thread_name_write_tdata(tdata, thread_name);

	return 0;
}